

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo_approach.cpp
# Opt level: O1

vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *
histogram_approach(vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                   *__return_storage_ptr__,Mat *img)

{
  size_type sVar1;
  pointer *ppaVar2;
  iterator iVar3;
  ulong uVar4;
  pointer plVar5;
  size_t sVar6;
  size_t sVar7;
  pointer plVar8;
  ulong uVar9;
  pointer plVar10;
  long lVar11;
  int iVar12;
  size_t sVar13;
  pointer plVar14;
  size_t sVar15;
  pointer plVar16;
  pointer plVar17;
  size_t sVar18;
  ulong uVar19;
  size_type sVar20;
  bool bVar21;
  vector<line_bound,_std::allocator<line_bound>_> horz_histo;
  array<int,_4UL> local_b8;
  long local_a8 [10];
  pointer local_58;
  pointer plStack_50;
  Size local_48;
  Range local_40;
  Range local_38;
  
  local_b8._M_elems._0_8_ = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"img","");
  cv::namedWindow((string *)&local_b8,0);
  if ((long *)local_b8._M_elems._0_8_ != local_a8) {
    operator_delete((void *)local_b8._M_elems._0_8_,local_a8[0] + 1);
  }
  local_b8._M_elems._0_8_ = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"img","");
  local_48.width = 0;
  local_48.height = 0;
  local_58 = (pointer)CONCAT44(local_58._4_4_,0x1010000);
  plStack_50 = (pointer)img;
  cv::imshow((string *)&local_b8,(_InputArray *)&local_58);
  if ((long *)local_b8._M_elems._0_8_ != local_a8) {
    operator_delete((void *)local_b8._M_elems._0_8_,local_a8[0] + 1);
  }
  cv::waitKey(0);
  cv::destroyAllWindows();
  iVar12 = *(int *)(img + 8);
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.width = 0;
  local_48.height = 0;
  local_58 = (pointer)0x0;
  plStack_50 = (pointer)0x0;
  std::vector<line_bound,_std::allocator<line_bound>_>::resize
            ((vector<line_bound,_std::allocator<line_bound>_> *)&local_58,(long)iVar12);
  if (0 < iVar12) {
    sVar20 = 0;
    do {
      sVar1 = sVar20 + 1;
      local_40.start = (int)sVar20;
      local_40.end = (int)sVar1;
      local_38.start = -0x80000000;
      local_38.end = 0x7fffffff;
      cv::Mat::Mat((Mat *)&local_b8,img,&local_40,&local_38);
      sVar6 = (size_t)local_b8._M_elems[3];
      if (sVar6 == 0) {
        uVar9 = 0;
        sVar7 = 0;
        sVar13 = 0;
        uVar19 = 0;
        sVar15 = 0;
      }
      else {
        sVar7 = 0;
        uVar9 = 0;
        sVar18 = 0;
        sVar15 = 0;
        uVar19 = 0;
        sVar13 = 0;
        do {
          if (*(char *)(local_a8[0] + sVar18) == '\0') {
            if (uVar9 < uVar19) {
              sVar7 = sVar18;
              uVar9 = uVar19;
              sVar13 = sVar15;
            }
            uVar19 = 0;
            sVar15 = 0;
          }
          else {
            bVar21 = uVar19 == 0;
            uVar19 = uVar19 + 1;
            if (bVar21) {
              sVar15 = sVar18;
            }
          }
          sVar18 = sVar18 + 1;
        } while (sVar6 != sVar18);
      }
      if (uVar9 < uVar19) {
        sVar13 = sVar15;
        uVar9 = uVar19;
        sVar7 = sVar6;
      }
      local_58[sVar20].ibegin = sVar13;
      local_58[sVar20].iend = sVar7;
      local_58[sVar20].size = uVar9;
      cv::Mat::~Mat((Mat *)&local_b8);
      sVar20 = sVar1;
    } while (sVar1 != (long)iVar12);
  }
  plVar5 = local_58;
  plVar8 = local_58;
  if ((local_58 != plStack_50) && (plVar14 = local_58 + 1, plVar14 != plStack_50)) {
    plVar8 = plVar14;
    if (local_58[1].size < local_58->size) {
      plVar8 = local_58;
    }
    plVar10 = local_58 + 2;
    if (plVar10 != plStack_50) {
      if (local_58->size <= local_58[1].size) {
        plVar14 = local_58;
      }
      do {
        plVar16 = plVar10 + 1;
        if (plVar16 == plStack_50) {
          if ((plVar14->size <= plVar10->size) && (plVar8->size <= plVar10->size)) {
            plVar8 = plVar10;
          }
          break;
        }
        uVar19 = plVar10->size;
        uVar9 = plVar10[1].size;
        bVar21 = uVar9 < uVar19;
        plVar17 = plVar10;
        uVar4 = uVar19;
        if (bVar21) {
          plVar17 = plVar16;
          uVar4 = uVar9;
        }
        if (!bVar21 && uVar9 != uVar19) {
          uVar19 = uVar9;
        }
        if (bVar21) {
          plVar16 = plVar10;
        }
        if (plVar14->size <= uVar4) {
          plVar17 = plVar14;
        }
        plVar14 = plVar17;
        if (plVar8->size <= uVar19) {
          plVar8 = plVar16;
        }
        plVar10 = plVar10 + 2;
      } while (plVar10 != plStack_50);
    }
  }
  uVar19 = plVar8->size;
  lVar11 = ((long)plStack_50 - (long)local_58 >> 3) * -0x5555555555555555 >> 2;
  plVar8 = local_58;
  if (0 < lVar11) {
    plVar8 = local_58 + lVar11 * 4;
    lVar11 = lVar11 + 1;
    plVar14 = local_58 + 2;
    do {
      if (uVar19 <= plVar14[-2].size) {
        plVar14 = plVar14 + -2;
        goto LAB_00111ec2;
      }
      if (uVar19 <= plVar14[-1].size) {
        plVar14 = plVar14 + -1;
        goto LAB_00111ec2;
      }
      if (uVar19 <= plVar14->size) goto LAB_00111ec2;
      if (uVar19 <= plVar14[1].size) {
        plVar14 = plVar14 + 1;
        goto LAB_00111ec2;
      }
      lVar11 = lVar11 + -1;
      plVar14 = plVar14 + 4;
    } while (1 < lVar11);
  }
  lVar11 = ((long)plStack_50 - (long)plVar8 >> 3) * -0x5555555555555555;
  if (lVar11 != 1) {
    if (lVar11 != 2) {
      plVar14 = plStack_50;
      if ((lVar11 != 3) || (plVar14 = plVar8, uVar19 <= plVar8->size)) goto LAB_00111ec2;
      plVar8 = plVar8 + 1;
    }
    plVar14 = plVar8;
    if (uVar19 <= plVar8->size) goto LAB_00111ec2;
    plVar8 = plVar8 + 1;
  }
  plVar14 = plStack_50;
  if (uVar19 <= plVar8->size) {
    plVar14 = plVar8;
  }
LAB_00111ec2:
  plVar14->ibegin = 0;
  local_b8._M_elems[1] = 0;
  local_b8._M_elems[0] = (uint)plVar14->ibegin;
  local_b8._M_elems[2] = (int)plVar14->iend;
  local_b8._M_elems[3] = 0;
  iVar3._M_current =
       (__return_storage_ptr__->
       super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>::
    _M_realloc_insert<std::array<int,4ul>>
              ((vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>> *)
               __return_storage_ptr__,iVar3,&local_b8);
  }
  else {
    *(undefined8 *)(iVar3._M_current)->_M_elems = local_b8._M_elems._0_8_;
    *(ulong *)((iVar3._M_current)->_M_elems + 2) = (ulong)(uint)local_b8._M_elems[2];
    ppaVar2 = &(__return_storage_ptr__->
               super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *ppaVar2 = *ppaVar2 + 1;
  }
  iVar12 = (int)((long)plVar14 - (long)plVar5 >> 3) * -0x55555555 + (int)uVar19;
  local_b8._M_elems[2] = (int)plVar14->ibegin;
  local_b8._M_elems[1] = 0;
  local_b8._M_elems[0] = local_b8._M_elems[2];
  iVar3._M_current =
       (__return_storage_ptr__->
       super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_b8._M_elems[3] = iVar12;
    std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>::
    _M_realloc_insert<std::array<int,4ul>>
              ((vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>> *)
               __return_storage_ptr__,iVar3,&local_b8);
  }
  else {
    *(undefined8 *)(iVar3._M_current)->_M_elems = local_b8._M_elems._0_8_;
    *(ulong *)((iVar3._M_current)->_M_elems + 2) = CONCAT44(iVar12,local_b8._M_elems[2]);
    ppaVar2 = &(__return_storage_ptr__->
               super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *ppaVar2 = *ppaVar2 + 1;
  }
  local_b8._M_elems[2] = (int)plVar14->iend;
  local_b8._M_elems[1] = 0;
  local_b8._M_elems[0] = local_b8._M_elems[2];
  iVar3._M_current =
       (__return_storage_ptr__->
       super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_b8._M_elems[3] = iVar12;
    std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>::
    _M_realloc_insert<std::array<int,4ul>>
              ((vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>> *)
               __return_storage_ptr__,iVar3,&local_b8);
  }
  else {
    *(undefined8 *)(iVar3._M_current)->_M_elems = local_b8._M_elems._0_8_;
    *(ulong *)((iVar3._M_current)->_M_elems + 2) = CONCAT44(iVar12,local_b8._M_elems[2]);
    ppaVar2 = &(__return_storage_ptr__->
               super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *ppaVar2 = *ppaVar2 + 1;
  }
  local_b8._M_elems[1] = iVar12;
  local_b8._M_elems[0] = (int)plVar14->ibegin;
  local_b8._M_elems[2] = (int)plVar14->iend;
  iVar3._M_current =
       (__return_storage_ptr__->
       super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_b8._M_elems[3] = iVar12;
    std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>::
    _M_realloc_insert<std::array<int,4ul>>
              ((vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>> *)
               __return_storage_ptr__,iVar3,&local_b8);
  }
  else {
    *(undefined8 *)(iVar3._M_current)->_M_elems = local_b8._M_elems._0_8_;
    *(ulong *)((iVar3._M_current)->_M_elems + 2) = CONCAT44(iVar12,local_b8._M_elems[2]);
    ppaVar2 = &(__return_storage_ptr__->
               super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *ppaVar2 = *ppaVar2 + 1;
    local_b8._M_elems[3] = iVar12;
  }
  if (local_58 != (pointer)0x0) {
    operator_delete(local_58,(long)local_48 - (long)local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::array<int, 4>> histogram_approach(const cv::Mat& img)
{
    cv::namedWindow("img", cv::WINDOW_NORMAL);
    cv::imshow("img", img);
    cv::waitKey(0);
    cv::destroyAllWindows();

    const int row_size = img.rows;
    std::vector<std::array<int, 4>> result;

    std::vector<line_bound> horz_histo;
    horz_histo.resize(row_size);

    for(int i = 0; i < row_size; i++)
    {
        horz_histo[i] = find_longest_line(img.row(i));
    }

    auto minmax = std::minmax_element(horz_histo.begin(), horz_histo.end(),
        [](const line_bound& lval, const line_bound& rval) { return lval.size < rval.size; });

    auto upper_threshold = minmax.second->size;

    auto upper_b = std::find_if(horz_histo.begin(), horz_histo.end(),
        [upper_threshold](const line_bound& v) { return v.size >= upper_threshold; });

    std::size_t upper_i = std::distance(horz_histo.begin(), upper_b);
    std::size_t lower_i = upper_i + minmax.second->size;
    upper_i *= static_cast<std::size_t>(0.95);
    lower_i *= static_cast<std::size_t>(1.05);
    upper_b->ibegin *= static_cast<std::size_t>(0.95);
    upper_b->iend *= static_cast<std::size_t>(1.05);

    result.push_back({int(upper_b->ibegin), int(upper_i), int(upper_b->iend), int(upper_i)});
    result.push_back({int(upper_b->ibegin), int(upper_i), int(upper_b->ibegin), int(lower_i)});
    result.push_back({int(upper_b->iend), int(upper_i), int(upper_b->iend), int(lower_i)});
    result.push_back({int(upper_b->ibegin), int(lower_i), int(upper_b->iend), int(lower_i)});

    return result;
}